

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int * GetCodepoints(char *text,int *count)

{
  uint uVar1;
  int iVar2;
  int local_28;
  int local_24;
  int i;
  int codepointsCount;
  int textLength;
  int bytesProcessed;
  int *count_local;
  char *text_local;
  
  _textLength = count;
  count_local = (int *)text;
  memset(GetCodepoints::codepoints,0,0x800);
  codepointsCount = 0;
  uVar1 = TextLength((char *)count_local);
  local_24 = 0;
  for (local_28 = 0; local_28 < (int)uVar1; local_28 = codepointsCount + local_28) {
    iVar2 = GetNextCodepoint((char *)((long)count_local + (long)local_28),&codepointsCount);
    GetCodepoints::codepoints[local_24] = iVar2;
    local_24 = local_24 + 1;
  }
  *_textLength = local_24;
  return GetCodepoints::codepoints;
}

Assistant:

int *GetCodepoints(const char *text, int *count)
{
    static int codepoints[MAX_TEXT_UNICODE_CHARS] = { 0 };
    memset(codepoints, 0, MAX_TEXT_UNICODE_CHARS*sizeof(int));

    int bytesProcessed = 0;
    int textLength = TextLength(text);
    int codepointsCount = 0;

    for (int i = 0; i < textLength; codepointsCount++)
    {
        codepoints[codepointsCount] = GetNextCodepoint(text + i, &bytesProcessed);
        i += bytesProcessed;
    }

    *count = codepointsCount;

    return codepoints;
}